

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::cast_from_variable_load
          (CompilerMSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  BuiltIn builtin;
  uint uVar4;
  SPIRExpression *pSVar5;
  SPIRVariable *var;
  SPIRType *pSVar6;
  SPIRType *pSVar7;
  char (*pacVar8) [4];
  BaseType expr_type_00;
  string *psVar9;
  SPIRType *in_R8;
  char (*in_R9) [2];
  char (*in_stack_fffffffffffffe18) [3];
  string local_1c8;
  undefined1 local_1a8 [40];
  string wrap_expr;
  
  bVar1 = Compiler::has_extended_decoration
                    ((Compiler *)this,source_id,SPIRVCrossDecorationPhysicalTypePacked);
  pSVar5 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,source_id);
  var = Compiler::maybe_get_backing_variable((Compiler *)this,source_id);
  uVar3 = Compiler::get_extended_decoration
                    ((Compiler *)this,source_id,SPIRVCrossDecorationPhysicalTypeID);
  pSVar6 = expr_type;
  if (uVar3 != 0) {
    pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  }
  if (var != (SPIRVariable *)0x0) {
    source_id = (var->super_IVariant).self.id;
    local_1a8._32_8_ = pSVar5;
    pSVar7 = Compiler::get_variable_data_type((Compiler *)this,var);
    if ((expr_type->basetype == Boolean) &&
       ((var->storage == StorageClassWorkgroup || (pSVar7->basetype == Struct)))) {
      bVar2 = Compiler::is_array((Compiler *)this,expr_type);
      if (bVar2) {
        in_R8 = expr_type;
        CompilerGLSL::to_rerolled_array_expression
                  (&wrap_expr,&this->super_CompilerGLSL,expr_type,expr,expr_type);
        ::std::__cxx11::string::operator=((string *)expr,(string *)&wrap_expr);
        psVar9 = &wrap_expr;
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_1c8,this,expr_type,0);
        in_R8 = (SPIRType *)0x2cdc84;
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&wrap_expr,(spirv_cross *)&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c2359,
                   (char (*) [2])expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)expr,(string *)&wrap_expr);
        ::std::__cxx11::string::~string((string *)&wrap_expr);
        psVar9 = &local_1c8;
      }
      ::std::__cxx11::string::~string((string *)psVar9);
    }
    if ((var != (SPIRVariable *)0x0) && ((this->msl_options).msl_version < 30000)) {
      if (var->storage == StorageClassWorkgroup) {
        uVar4 = expr_type->columns;
      }
      else {
        if (((pSVar7->basetype != Struct) ||
            (bVar2 = Compiler::has_extended_decoration
                               ((Compiler *)this,(pSVar7->super_IVariant).self.id,
                                SPIRVCrossDecorationWorkgroupStruct), !bVar2)) || (bVar1))
        goto LAB_001cc557;
        uVar4 = expr_type->columns;
      }
      if (1 < uVar4) {
        SPIRType::SPIRType((SPIRType *)&wrap_expr,pSVar6);
        if (((SPIRExpression *)local_1a8._32_8_ != (SPIRExpression *)0x0) &&
           (*(bool *)(local_1a8._32_8_ + 0x39) == true)) {
          wrap_expr.field_2._8_8_ =
               CONCAT44((int)wrap_expr.field_2._8_8_,(int)((ulong)wrap_expr.field_2._8_8_ >> 0x20));
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_1a8,this,&wrap_expr,0);
        in_R8 = (SPIRType *)0x2cdc84;
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&local_1c8,(spirv_cross *)local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c2359,
                   (char (*) [2])expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,
                   in_R9);
        ::std::__cxx11::string::operator=((string *)expr,(string *)&local_1c8);
        ::std::__cxx11::string::~string((string *)&local_1c8);
        ::std::__cxx11::string::~string((string *)local_1a8);
        SPIRType::~SPIRType((SPIRType *)&wrap_expr);
      }
    }
  }
LAB_001cc557:
  bVar1 = Compiler::has_decoration((Compiler *)this,(ID)source_id,DecorationBuiltIn);
  if (bVar1) {
    builtin = Compiler::get_decoration((Compiler *)this,(ID)source_id,DecorationBuiltIn);
    expr_type_00 = expr_type->basetype;
    uVar3 = expr_type->width;
    if (builtin < (BuiltInSubgroupId|BuiltInCullDistance)) {
      if ((0xe103f100680U >> ((ulong)builtin & 0x3f) & 1) != 0) goto LAB_001cc5a2;
      if ((0x1800UL >> ((ulong)builtin & 0x3f) & 1) == 0) goto LAB_001cc8ad;
      bVar1 = is_tesc_shader(this);
      if (bVar1) {
        expr_type_00 = Half;
        uVar3 = 0x10;
      }
    }
    else {
LAB_001cc8ad:
      if (((builtin - BuiltInBaseVertex < 0x11) &&
          ((0x10003U >> (builtin - BuiltInBaseVertex & 0x1f) & 1) != 0)) ||
         (builtin == BuiltInFragStencilRefEXT)) {
LAB_001cc5a2:
        uVar3 = 0x20;
        expr_type_00 = UInt;
      }
    }
    bVar1 = Compiler::is_array((Compiler *)this,expr_type);
    if ((builtin == BuiltInSampleMask) && (bVar1)) {
      pacVar8 = (char (*) [4])0x0;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1c8,this,expr_type);
      join<std::__cxx11::string,char_const(&)[4]>
                (&wrap_expr,(spirv_cross *)&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"({ ",pacVar8)
      ;
      ::std::__cxx11::string::~string((string *)&local_1c8);
      pSVar6 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(expr_type->parent_type).id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_1a8,this,pSVar6,0);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_1c8,(spirv_cross *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c2359,
                 (char (*) [2])expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,in_R9
                );
      ::std::__cxx11::string::append((string *)&wrap_expr);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::__cxx11::string::~string((string *)local_1a8);
      ::std::__cxx11::string::append((char *)&wrap_expr);
    }
    else {
      if (expr_type_00 == expr_type->basetype) {
        return;
      }
      bVar1 = Compiler::is_array((Compiler *)this,expr_type);
      if ((builtin - BuiltInTessLevelOuter < 2) && (bVar1)) {
        pacVar8 = (char (*) [4])0x0;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1c8,this,expr_type)
        ;
        join<std::__cxx11::string,char_const(&)[4]>
                  (&wrap_expr,(spirv_cross *)&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"({ ",
                   pacVar8);
        ::std::__cxx11::string::~string((string *)&local_1c8);
        uVar3 = get_physical_tess_level_array_size(this,builtin);
        uVar4 = 0;
        while (local_1a8._0_4_ = uVar4, uVar4 < uVar3) {
          if (uVar3 < 2) {
            join<char_const(&)[7],std::__cxx11::string&,char_const(&)[2]>
                      (&local_1c8,(spirv_cross *)"float(",(char (*) [7])expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84
                       ,(char (*) [2])in_R8);
            ::std::__cxx11::string::append((string *)&wrap_expr);
          }
          else {
            in_R8 = (SPIRType *)local_1a8;
            join<char_const(&)[7],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                      (&local_1c8,(spirv_cross *)"float(",(char (*) [7])expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2a2336
                       ,(char (*) [2])in_R8,(uint *)0x2c1dfa,in_stack_fffffffffffffe18);
            ::std::__cxx11::string::append((string *)&wrap_expr);
          }
          ::std::__cxx11::string::~string((string *)&local_1c8);
          uVar4 = local_1a8._0_4_ + 1;
          if (uVar4 < uVar3) {
            ::std::__cxx11::string::append((char *)&wrap_expr);
            uVar4 = local_1a8._0_4_ + 1;
          }
        }
        bVar1 = Compiler::is_tessellating_triangles((Compiler *)this);
        if (bVar1) {
          ::std::__cxx11::string::append((char *)&wrap_expr);
        }
        ::std::__cxx11::string::append((char *)&wrap_expr);
      }
      else {
        if (uVar3 != expr_type->width) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_1c8,this,expr_type,0);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (&wrap_expr,(spirv_cross *)&local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c2359,
                     (char (*) [2])expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,
                     in_R9);
          goto LAB_001cc913;
        }
        CompilerGLSL::bitcast_expression
                  (&wrap_expr,&this->super_CompilerGLSL,expr_type,expr_type_00,expr);
      }
    }
    psVar9 = &wrap_expr;
    ::std::__cxx11::string::operator=((string *)expr,(string *)psVar9);
  }
  else {
    if (var == (SPIRVariable *)0x0) {
      return;
    }
    if (var->storage != StorageClassInput) {
      return;
    }
    pSVar6 = Compiler::get<spirv_cross::SPIRType>
                       ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
    if (pSVar6->basetype == Struct) {
      return;
    }
    if (expr_type->basetype == pSVar6->basetype) {
      return;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1c8,this,expr_type,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&wrap_expr,(spirv_cross *)&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c2359,
               (char (*) [2])expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdc84,in_R9);
LAB_001cc913:
    ::std::__cxx11::string::operator=((string *)expr,(string *)&wrap_expr);
    ::std::__cxx11::string::~string((string *)&wrap_expr);
    psVar9 = &local_1c8;
  }
  ::std::__cxx11::string::~string((string *)psVar9);
  return;
}

Assistant:

void CompilerMSL::cast_from_variable_load(uint32_t source_id, std::string &expr, const SPIRType &expr_type)
{
	bool is_packed = has_extended_decoration(source_id, SPIRVCrossDecorationPhysicalTypePacked);
	auto *source_expr = maybe_get<SPIRExpression>(source_id);
	auto *var = maybe_get_backing_variable(source_id);
	const SPIRType *var_type = nullptr, *phys_type = nullptr;

	if (uint32_t phys_id = get_extended_decoration(source_id, SPIRVCrossDecorationPhysicalTypeID))
		phys_type = &get<SPIRType>(phys_id);
	else
		phys_type = &expr_type;

	if (var)
	{
		source_id = var->self;
		var_type = &get_variable_data_type(*var);
	}

	bool rewrite_boolean_load =
	    expr_type.basetype == SPIRType::Boolean &&
	    (var && (var->storage == StorageClassWorkgroup || var_type->basetype == SPIRType::Struct));

	// Type fixups for workgroup variables if they are booleans.
	if (rewrite_boolean_load)
	{
		if (is_array(expr_type))
			expr = to_rerolled_array_expression(expr_type, expr, expr_type);
		else
			expr = join(type_to_glsl(expr_type), "(", expr, ")");
	}

	// Type fixups for workgroup variables if they are matrices.
	// Don't do fixup for packed types; those are handled specially.
	// FIXME: Maybe use a type like spvStorageMatrix for packed matrices?
	if (!msl_options.supports_msl_version(3, 0) && var &&
	    (var->storage == StorageClassWorkgroup ||
	     (var_type->basetype == SPIRType::Struct &&
	      has_extended_decoration(var_type->self, SPIRVCrossDecorationWorkgroupStruct) && !is_packed)) &&
	    expr_type.columns > 1)
	{
		SPIRType matrix_type = *phys_type;
		if (source_expr && source_expr->need_transpose)
			swap(matrix_type.vecsize, matrix_type.columns);
		matrix_type.array.clear();
		matrix_type.array_size_literal.clear();
		expr = join(type_to_glsl(matrix_type), "(", expr, ")");
	}

	// Only interested in standalone builtin variables in the switch below.
	if (!has_decoration(source_id, DecorationBuiltIn))
	{
		// If the backing variable does not match our expected sign, we can fix it up here.
		// See ensure_correct_input_type().
		if (var && var->storage == StorageClassInput)
		{
			auto &base_type = get<SPIRType>(var->basetype);
			if (base_type.basetype != SPIRType::Struct && expr_type.basetype != base_type.basetype)
				expr = join(type_to_glsl(expr_type), "(", expr, ")");
		}
		return;
	}

	auto builtin = static_cast<BuiltIn>(get_decoration(source_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;
	auto expected_width = expr_type.width;
	switch (builtin)
	{
	case BuiltInGlobalInvocationId:
	case BuiltInLocalInvocationId:
	case BuiltInWorkgroupId:
	case BuiltInLocalInvocationIndex:
	case BuiltInWorkgroupSize:
	case BuiltInNumWorkgroups:
	case BuiltInLayer:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInPrimitiveId:
	case BuiltInSubgroupSize:
	case BuiltInSubgroupLocalInvocationId:
	case BuiltInViewIndex:
	case BuiltInVertexIndex:
	case BuiltInInstanceIndex:
	case BuiltInBaseInstance:
	case BuiltInBaseVertex:
	case BuiltInSampleMask:
		expected_type = SPIRType::UInt;
		expected_width = 32;
		break;

	case BuiltInTessLevelInner:
	case BuiltInTessLevelOuter:
		if (is_tesc_shader())
		{
			expected_type = SPIRType::Half;
			expected_width = 16;
		}
		break;

	default:
		break;
	}

	if (is_array(expr_type) && builtin == BuiltInSampleMask)
	{
		// Needs special handling.
		auto wrap_expr = join(type_to_glsl(expr_type), "({ ");
		wrap_expr += join(type_to_glsl(get<SPIRType>(expr_type.parent_type)), "(", expr, ")");
		wrap_expr += " })";
		expr = std::move(wrap_expr);
	}
	else if (expected_type != expr_type.basetype)
	{
		if (is_array(expr_type) && (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter))
		{
			// Triggers when loading TessLevel directly as an array.
			// Need explicit padding + cast.
			auto wrap_expr = join(type_to_glsl(expr_type), "({ ");

			uint32_t array_size = get_physical_tess_level_array_size(builtin);
			for (uint32_t i = 0; i < array_size; i++)
			{
				if (array_size > 1)
					wrap_expr += join("float(", expr, "[", i, "])");
				else
					wrap_expr += join("float(", expr, ")");
				if (i + 1 < array_size)
					wrap_expr += ", ";
			}

			if (is_tessellating_triangles())
				wrap_expr += ", 0.0";

			wrap_expr += " })";
			expr = std::move(wrap_expr);
		}
		else
		{
			// These are of different widths, so we cannot do a straight bitcast.
			if (expected_width != expr_type.width)
				expr = join(type_to_glsl(expr_type), "(", expr, ")");
			else
				expr = bitcast_expression(expr_type, expected_type, expr);
		}
	}
}